

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall mario::TimerQueue::addTimerInLoop(TimerQueue *this,Timer *timer)

{
  bool bVar1;
  
  EventLoop::assertInLoopThread(this->_loop);
  bVar1 = insert(this,timer);
  if (bVar1) {
    detail::resetTimerfd(this->_timerfd,(Timestamp)(timer->_expiration)._microSecondsSinceEpoch);
    return;
  }
  return;
}

Assistant:

void TimerQueue::addTimerInLoop(Timer* timer) {
    _loop->assertInLoopThread();
    bool earliestChanged = insert(timer);
    if (earliestChanged) {
        resetTimerfd(_timerfd, timer->expiration());
    }
}